

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

uint anon_unknown.dwarf_19d33d::getUdevAttributeUint(udev_device *udevDevice,string *attributeName)

{
  char *__nptr;
  ulong uVar1;
  long in_RDI;
  uint value;
  char *attribute;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  udev_device *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    __nptr = getUdevAttribute(in_stack_ffffffffffffffe0,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_4 = 0;
    if (__nptr != (char *)0x0) {
      uVar1 = strtoul(__nptr,(char **)0x0,0x10);
      local_4 = (uint)uVar1;
    }
  }
  return local_4;
}

Assistant:

unsigned int getUdevAttributeUint(udev_device* udevDevice, const std::string& attributeName)
    {
        if (!udevDevice)
            return 0;

        const char* attribute = getUdevAttribute(udevDevice, attributeName);
        unsigned int value = 0;

        if (attribute)
            value = static_cast<unsigned int>(std::strtoul(attribute, NULL, 16));

        return value;
    }